

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Labels.cpp
# Opt level: O1

int __thiscall Labels::update(Labels *this)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  
  if ((DebugFlag) && (bVar1 = isCurrentDebugType("labels"), bVar1)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"update",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"current size: ",0xe);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (current_size == 0) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if (labels_activated[uVar4] == true) {
        this->labels_counter[uVar4] = this->labels_counter[uVar4] + 1;
        iVar3 = iVar3 + 1;
      }
      if ((DebugFlag == true) && (bVar1 = isCurrentDebugType("labels"), bVar1)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"update",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"activated[",10);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ? ",4);
        poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," counter? ",10);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < current_size);
  }
  if ((DebugFlag != false) && (bVar1 = isCurrentDebugType("info"), bVar1)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"update",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ENDING",6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
  }
  return iVar3;
}

Assistant:

int Labels::update(){
    // For each activated labels, increase counter.
    int cnt = 0;
    DEBUGG("labels", "current size: " << current_size);
    for(unsigned int i=0 ; i<current_size ; i++){
        if(labels_activated[i]){
            labels_counter[i]++;
            cnt++;
        }
        DEBUGG("labels","activated["<<
                i << "] ? "<< labels_activated[i]<<
                " counter? "<<labels_counter[i]);
    }
    DEBUGINFO("ENDING");
    return cnt;
}